

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldLiteGenerator::GenerateVisitCode
          (ImmutableEnumFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  LogMessage *other;
  LogFinisher local_5d [13];
  LogMessage local_50;
  Printer *local_18;
  Printer *printer_local;
  ImmutableEnumFieldLiteGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  pFVar2 = FieldDescriptor::file(this->descriptor_);
  bVar1 = SupportFieldPresence(pFVar2);
  if (bVar1) {
    io::Printer::Print(local_18,&this->variables_,
                       "$name$_ = visitor.visitInt(has$capitalized_name$(), $name$_,\n    other.has$capitalized_name$(), other.$name$_);\n"
                      );
  }
  else {
    pFVar2 = FieldDescriptor::file(this->descriptor_);
    bVar1 = SupportUnknownEnumValue(pFVar2);
    if (bVar1) {
      io::Printer::Print(local_18,&this->variables_,
                         "$name$_ = visitor.visitInt($name$_ != $default_number$, $name$_,    other.$name$_ != $default_number$, other.$name$_);\n"
                        );
    }
    else {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_enum_field_lite.cc"
                 ,0x117);
      other = internal::LogMessage::operator<<(&local_50,"Can\'t reach here.");
      internal::LogFinisher::operator=(local_5d,other);
      internal::LogMessage::~LogMessage(&local_50);
    }
  }
  return;
}

Assistant:

void ImmutableEnumFieldLiteGenerator::
GenerateVisitCode(io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    printer->Print(variables_,
      "$name$_ = visitor.visitInt(has$capitalized_name$(), $name$_,\n"
      "    other.has$capitalized_name$(), other.$name$_);\n");
  } else if (SupportUnknownEnumValue(descriptor_->file())) {
    printer->Print(variables_,
      "$name$_ = visitor.visitInt($name$_ != $default_number$, $name$_,"
      "    other.$name$_ != $default_number$, other.$name$_);\n");
  } else {
    GOOGLE_LOG(FATAL) << "Can't reach here.";
  }
}